

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w)

{
  uint nrows;
  uint ncols;
  CUPDLPproblem *problem;
  CUPDLPdata *pCVar1;
  uint uVar2;
  cupdlp_retcode cVar3;
  CUPDLPsettings *pCVar4;
  CUPDLPresobj *pCVar5;
  CUPDLPiterates *pCVar6;
  CUPDLPstepsize *pCVar7;
  CUPDLPtimers *pCVar8;
  CUPDLPvec *pCVar9;
  cupdlp_float *pcVar10;
  cupdlp_retcode cVar11;
  size_t __nmemb;
  
  pCVar4 = (CUPDLPsettings *)malloc(0x48);
  w->settings = pCVar4;
  cVar11 = 1;
  if (pCVar4 != (CUPDLPsettings *)0x0) {
    pCVar5 = (CUPDLPresobj *)malloc(0x188);
    w->resobj = pCVar5;
    if (pCVar5 != (CUPDLPresobj *)0x0) {
      pCVar6 = (CUPDLPiterates *)malloc(0xa0);
      w->iterates = pCVar6;
      if (pCVar6 != (CUPDLPiterates *)0x0) {
        pCVar7 = (CUPDLPstepsize *)malloc(0x40);
        w->stepsize = pCVar7;
        if (pCVar7 != (CUPDLPstepsize *)0x0) {
          pCVar8 = (CUPDLPtimers *)malloc(0x58);
          w->timers = pCVar8;
          if (pCVar8 != (CUPDLPtimers *)0x0) {
            pCVar8->nIter = 0;
            pCVar8->dSolvingTime = 0.0;
            pCVar8->dSolvingBeg = 0.0;
            pCVar8->dScalingTime = 0.0;
            pCVar8->dPresolveTime = 0.0;
            pCVar8->dAtyTime = 0.0;
            pCVar8->dAxTime = 0.0;
            pCVar8->dComputeResidualsTime = 0.0;
            pCVar8->dUpdateIterateTime = 0.0;
            pCVar8->nAtyCalls = 0;
            pCVar8->nAxCalls = 0;
            pCVar8->nComputeResidualsCalls = 0;
            pCVar8->nUpdateIterateCalls = 0;
            time((time_t *)0x0);
            pCVar9 = (CUPDLPvec *)malloc(0x10);
            w->buffer = pCVar9;
            if (pCVar9 != (CUPDLPvec *)0x0) {
              problem = w->problem;
              pCVar1 = problem->data;
              nrows = pCVar1->nRows;
              pcVar10 = (cupdlp_float *)calloc((long)(int)nrows,8);
              pCVar9->data = pcVar10;
              if (pcVar10 != (cupdlp_float *)0x0) {
                pCVar9->len = nrows;
                ncols = pCVar1->nCols;
                uVar2 = nrows;
                if ((int)nrows < (int)ncols) {
                  uVar2 = ncols;
                }
                __nmemb = 0x800;
                if (0x800 < (int)uVar2) {
                  __nmemb = (size_t)uVar2;
                }
                pcVar10 = (cupdlp_float *)calloc(__nmemb,8);
                w->buffer2 = pcVar10;
                if (pcVar10 != (cupdlp_float *)0x0) {
                  pcVar10 = (cupdlp_float *)calloc(__nmemb,8);
                  w->buffer3 = pcVar10;
                  if (pcVar10 != (cupdlp_float *)0x0) {
                    pcVar10 = (cupdlp_float *)calloc((long)(int)ncols,8);
                    w->colScale = pcVar10;
                    if (pcVar10 != (cupdlp_float *)0x0) {
                      pcVar10 = (cupdlp_float *)calloc((long)(int)nrows,8);
                      w->rowScale = pcVar10;
                      if (pcVar10 != (cupdlp_float *)0x0) {
                        pCVar4 = w->settings;
                        pCVar4->nLogLevel = 2;
                        pCVar4->nLogInterval = 100;
                        pCVar4->dTimeLim = 3600.0;
                        pCVar4->ifScaling = 1;
                        pCVar4->iScalingMethod = 3;
                        pCVar4->eRestartMethod = PDHG_GPU_RESTART;
                        pCVar4->iInfNormAbsLocalTermination = 0;
                        pCVar4->nIterLim = 0x7fffffff;
                        pCVar4->dScalingLimit = 5.0;
                        pCVar4->dPrimalTol = 0.0001;
                        pCVar4->dDualTol = 0.0001;
                        pCVar4->dGapTol = 0.0001;
                        cVar3 = resobj_Alloc(w->resobj,problem,ncols,nrows);
                        if (cVar3 == 0) {
                          pCVar1 = w->problem->data;
                          cVar3 = iterates_Alloc(w->iterates,pCVar1->nCols,pCVar1->nRows);
                          if (cVar3 == 0) {
                            pCVar7 = w->stepsize;
                            pCVar7->eLineSearchMethod = PDHG_ADAPTIVE_LINESEARCH;
                            pCVar7->dPrimalStep = 0.0;
                            pCVar7->dDualStep = 0.0;
                            pCVar7->dSumPrimalStep = 0.0;
                            pCVar7->dSumDualStep = 0.0;
                            pCVar7->dBeta = 0.0;
                            pCVar7->dTheta = 0.0;
                            pCVar7->nStepSizeIter = 0;
                            cVar11 = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return cVar11;
}

Assistant:

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLP_INIT_SETTINGS(w->settings, 1);
  CUPDLP_INIT_RESOBJ(w->resobj, 1);
  CUPDLP_INIT_ITERATES(w->iterates, 1);
  CUPDLP_INIT_STEPSIZE(w->stepsize, 1);

  CUPDLP_INIT_TIMERS(w->timers, 1);
  CUPDLP_CALL(timers_Alloc(w->timers));

  cupdlp_float begin = getTimeStamp();
  // buffer
  CUPDLP_INIT_CUPDLP_VEC(w->buffer, 1);
  CUPDLP_CALL(vec_Alloc(w->buffer, w->problem->data->nRows));


  cupdlp_init_zero_vec_double(w->buffer2,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#if defined(CUPDLP_CPU) || !(USE_KERNELS) || (CUPDLP_DUMP_LINESEARCH_STATS && CUPDLP_DEBUG)
  cupdlp_init_zero_vec_double(w->buffer3,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#else
  w->buffer3 = NULL;
#endif

  // for scaling
  cupdlp_init_zero_vec_double(w->colScale, w->problem->data->nCols);
  cupdlp_init_zero_vec_double(w->rowScale, w->problem->data->nRows);

  CUPDLP_CALL(settings_Alloc(w->settings));
  CUPDLP_CALL(resobj_Alloc(w->resobj, w->problem, w->problem->data->nCols,
                           w->problem->data->nRows));
  CUPDLP_CALL(iterates_Alloc(w->iterates, w->problem->data->nCols,
                             w->problem->data->nRows));
  CUPDLP_CALL(stepsize_Alloc(w->stepsize));

#ifndef CUPDLP_CPU
  //   CHECK_CUSPARSE(cusparseCreate(&w->cusparsehandle));
  //   CHECK_CUBLAS(cublasCreate(&w->cublashandle));
  CUPDLP_CALL(cuda_alloc_MVbuffer(
      //   w->problem->data->matrix_format,
      w->cusparsehandle, w->problem->data->csc_matrix->cuda_csc,
      w->iterates->x[0]->cuda_vec, w->iterates->ax[0]->cuda_vec,
      w->problem->data->csr_matrix->cuda_csr, w->iterates->y[0]->cuda_vec,
      w->iterates->aty[0]->cuda_vec, &w->dBuffer_csc_ATy, &w->dBuffer_csr_Ax))
  w->timers->AllocMem_CopyMatToDeviceTime += getTimeStamp() - begin;
#endif

exit_cleanup:
  return retcode;
}